

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AuthCheck(Parse *pParse,int code,char *zArg1,char *zArg2,char *zArg3)

{
  sqlite3 *psVar1;
  uint uVar2;
  int iVar3;
  char *zFormat;
  
  psVar1 = pParse->db;
  iVar3 = 0;
  if ((((psVar1->init).busy == '\0') && (iVar3 = 0, pParse->declareVtab == '\0')) &&
     (psVar1->xAuth != (sqlite3_xauth)0x0)) {
    uVar2 = (*psVar1->xAuth)(psVar1->pAuthArg,code,zArg1,zArg2,zArg3,pParse->zAuthContext);
    if (uVar2 == 1) {
      iVar3 = 0x17;
      zFormat = "not authorized";
    }
    else {
      if ((uVar2 & 0xfffffffd) == 0) {
        return uVar2;
      }
      iVar3 = 1;
      zFormat = "authorizer malfunction";
    }
    sqlite3ErrorMsg(pParse,zFormat);
    pParse->rc = iVar3;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3AuthCheck(
  Parse *pParse,
  int code,
  const char *zArg1,
  const char *zArg2,
  const char *zArg3
){
  sqlite3 *db = pParse->db;
  int rc;

  /* Don't do any authorization checks if the database is initialising
  ** or if the parser is being invoked from within sqlite3_declare_vtab.
  */
  if( db->init.busy || IN_DECLARE_VTAB ){
    return SQLITE_OK;
  }

  if( db->xAuth==0 ){
    return SQLITE_OK;
  }
  rc = db->xAuth(db->pAuthArg, code, zArg1, zArg2, zArg3, pParse->zAuthContext
#ifdef SQLITE_USER_AUTHENTICATION
                 ,db->auth.zAuthUser
#endif
                );
  if( rc==SQLITE_DENY ){
    sqlite3ErrorMsg(pParse, "not authorized");
    pParse->rc = SQLITE_AUTH;
  }else if( rc!=SQLITE_OK && rc!=SQLITE_IGNORE ){
    rc = SQLITE_DENY;
    sqliteAuthBadReturnCode(pParse);
  }
  return rc;
}